

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,void *ptr)

{
  ImU32 IVar1;
  uint *puVar2;
  void *ptr_local;
  
  ptr_local = ptr;
  puVar2 = ImVector<unsigned_int>::back(&this->IDStack);
  IVar1 = ImHashData(&ptr_local,8,*puVar2);
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    return ImHashData(&ptr, sizeof(void*), seed);
}